

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

void __thiscall
GEO::KdTree::get_minmax
          (KdTree *this,index_t b,index_t e,coord_index_t coord,double *minval,double *maxval)

{
  uint *puVar1;
  double *pdVar2;
  float64 fVar3;
  double local_40;
  double val;
  double *pdStack_30;
  index_t i;
  double *maxval_local;
  double *minval_local;
  index_t local_18;
  index_t iStack_14;
  coord_index_t coord_local;
  index_t e_local;
  index_t b_local;
  KdTree *this_local;
  
  pdStack_30 = maxval;
  maxval_local = minval;
  minval_local._7_1_ = coord;
  local_18 = e;
  iStack_14 = b;
  _e_local = this;
  fVar3 = Numeric::max_float64();
  *maxval_local = (double)fVar3;
  fVar3 = Numeric::min_float64();
  *pdStack_30 = (double)fVar3;
  for (val._4_4_ = iStack_14; val._4_4_ < local_18; val._4_4_ = val._4_4_ + 1) {
    puVar1 = vector<unsigned_int>::operator[](&this->point_index_,val._4_4_);
    pdVar2 = NearestNeighborSearch::point_ptr(&this->super_NearestNeighborSearch,*puVar1);
    local_40 = pdVar2[minval_local._7_1_];
    pdVar2 = std::min<double>(maxval_local,&local_40);
    *maxval_local = *pdVar2;
    pdVar2 = std::max<double>(pdStack_30,&local_40);
    *pdStack_30 = *pdVar2;
  }
  return;
}

Assistant:

void get_minmax(
	    index_t b, index_t e, coord_index_t coord,
	    double& minval, double& maxval
	) const {
	    minval = Numeric::max_float64();
	    maxval = Numeric::min_float64();
	    for(index_t i = b; i < e; ++i) {
		double val = point_ptr(point_index_[i])[coord];
		minval = std::min(minval, val);
		maxval = std::max(maxval, val);
	    }
	}